

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void check_perm(char *what,int n,int *perm)

{
  int iVar1;
  int *addr;
  ulong uVar2;
  ulong uVar3;
  char msg [256];
  char acStack_118 [256];
  
  addr = int32Malloc(n);
  uVar2 = 0;
  uVar3 = 0;
  if (0 < n) {
    uVar3 = (ulong)(uint)n;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    addr[uVar2] = 0;
  }
  uVar2 = 0;
  while( true ) {
    if (uVar3 == uVar2) {
      superlu_free(addr);
      printf("check_perm: %s: n %d\n",what,n);
      return;
    }
    iVar1 = perm[uVar2];
    if ((n <= iVar1) || (addr[iVar1] == 1)) break;
    addr[iVar1] = 1;
    uVar2 = uVar2 + 1;
  }
  printf("%s: Not a valid PERM[%d] = %d\n",what);
  sprintf(acStack_118,"%s at line %d in file %s\n","check_perm",0x264,
          "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/util.c");
  superlu_abort_and_exit(acStack_118);
}

Assistant:

void check_perm(const char *what, int n, const int *perm)
{
    register int i;
    int          *marker;
    /*marker = (int *) calloc(n, sizeof(int));*/
    marker = int32Malloc(n);
    for (i = 0; i < n; ++i) marker[i] = 0;

    for (i = 0; i < n; ++i) {
	if ( marker[perm[i]] == 1 || perm[i] >= n ) {
	    printf("%s: Not a valid PERM[%d] = %d\n", what, i, perm[i]);
	    ABORT("check_perm");
	} else {
	    marker[perm[i]] = 1;
	}
    }

    SUPERLU_FREE(marker);
    printf("check_perm: %s: n %d\n", what, n);
}